

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O2

void __thiscall
DBaseStatusBar::AttachMessage(DBaseStatusBar *this,DHUDMessage *msg,DWORD id,int layer)

{
  DHUDMessage *pDVar1;
  ulong uVar2;
  TObjPtr<DHUDMessage> *pTVar3;
  
  if (1 < id + 1) {
    pDVar1 = DetachMessage(this,id);
    if (pDVar1 != (DHUDMessage *)0x0) {
      (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
    }
  }
  uVar2 = 0;
  if ((uint)layer < 3) {
    uVar2 = (ulong)(uint)layer;
  }
  pTVar3 = this->Messages + uVar2;
  while ((pDVar1 = (pTVar3->field_0).p, pDVar1 != (DHUDMessage *)0x0 && (id < pDVar1->SBarID))) {
    pTVar3 = &pDVar1->Next;
    this = (DBaseStatusBar *)pDVar1;
  }
  (msg->Next).field_0.p = pDVar1;
  msg->SBarID = id;
  (pTVar3->field_0).p = msg;
  if ((((msg->super_DObject).ObjectFlags & 3) != 0) &&
     (((((DHUDMessage *)this)->super_DObject).ObjectFlags & 4) != 0)) {
    GC::Barrier(&this->super_DObject,&msg->super_DObject);
    return;
  }
  return;
}

Assistant:

void DBaseStatusBar::AttachMessage (DHUDMessage *msg, DWORD id, int layer)
{
	DHUDMessage *old = NULL;
	DHUDMessage **prev;
	DObject *container = this;

	old = (id == 0 || id == 0xFFFFFFFF) ? NULL : DetachMessage (id);
	if (old != NULL)
	{
		old->Destroy();
	}

	// Merge unknown layers into the default layer.
	if ((size_t)layer >= countof(Messages))
	{
		layer = HUDMSGLayer_Default;
	}

	prev = &Messages[layer];

	// The ID serves as a priority, where lower numbers appear in front of
	// higher numbers. (i.e. The list is sorted in descending order, since
	// it gets drawn back to front.)
	while (*prev != NULL && (*prev)->SBarID > id)
	{
		container = *prev;
		prev = &(*prev)->Next;
	}

	msg->Next = *prev;
	msg->SBarID = id;
	*prev = msg;
	GC::WriteBarrier(container, msg);
}